

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QLinuxFbDevice::Output>::begin(QList<QLinuxFbDevice::Output> *this)

{
  Output *n;
  QArrayDataPointer<QLinuxFbDevice::Output> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QLinuxFbDevice::Output> *)0x11efb9);
  QArrayDataPointer<QLinuxFbDevice::Output>::operator->(in_RDI);
  n = QArrayDataPointer<QLinuxFbDevice::Output>::begin
                ((QArrayDataPointer<QLinuxFbDevice::Output> *)0x11efca);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }